

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

Result * __thiscall
deqp::gles31::Functional::anon_unknown_1::TransformFeedbackHandler<tcu::Vector<float,_3>_>::
renderAndGetPrimitives
          (Result *__return_storage_ptr__,TransformFeedbackHandler<tcu::Vector<float,_3>_> *this,
          deUint32 programGL,deUint32 tfPrimTypeGL,int numBindings,VertexArrayBinding *bindings,
          int numVertices)

{
  pointer pVVar1;
  PrimitiveType PVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  Result *extraout_RAX;
  Result *extraout_RAX_00;
  Result *pRVar9;
  TestError *pTVar10;
  long *plVar11;
  ulong *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_248;
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  Result *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  PrimitiveList local_1a8 [4];
  ios_base local_138 [264];
  long lVar5;
  
  local_1d0 = __return_storage_ptr__;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0xd0))(0x8e22,(this->m_tf).super_ObjectWrapper.m_object);
  (**(code **)(lVar5 + 0x40))(0x8c8e,(this->m_tfBuffer).super_ObjectWrapper.m_object);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,(this->m_tfBuffer).super_ObjectWrapper.m_object);
  (**(code **)(lVar5 + 0x20))(0x8c88,(this->m_tfPrimQuery).super_ObjectWrapper.m_object);
  (**(code **)(lVar5 + 0x30))(tfPrimTypeGL);
  local_1a8[0].type = PRIMITIVETYPE_PATCHES;
  local_1a8[0].numElements = numVertices;
  local_1a8[0].indexType = INDEXTYPE_LAST;
  local_1a8[0].indices = (void *)0x0;
  glu::draw(this->m_renderCtx,programGL,numBindings,bindings,local_1a8,(DrawUtilCallback *)0x0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x15e);
  (**(code **)(lVar5 + 0x638))();
  (**(code **)(lVar5 + 0x628))(0x8c88);
  local_1a8[0].type = ~PRIMITIVETYPE_TRIANGLES;
  (**(code **)(lVar5 + 0xa20))((this->m_tfPrimQuery).super_ObjectWrapper.m_object,0x8866,local_1a8);
  PVar2 = local_1a8[0].type;
  if (local_1a8[0].type == ~PRIMITIVETYPE_TRIANGLES) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,(char *)0x0,"result != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x104);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = -1;
  if (tfPrimTypeGL < 5) {
    iVar3 = *(int *)(&DAT_01c43538 + (ulong)tfPrimTypeGL * 4);
  }
  uVar15 = iVar3 * local_1a8[0].type;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&local_248,(long)(int)uVar15,(allocator_type *)local_1a8);
  pVVar1 = local_248.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (**(code **)(lVar5 + 0xd00))(0x8c8e,0,(long)(int)(uVar15 * 0xc),1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_268 = &local_258;
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_258 = *plVar11;
    lStack_250 = plVar7[3];
  }
  else {
    local_258 = *plVar11;
    local_268 = (long *)*plVar7;
  }
  local_260 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  glu::getBufferTargetName(0x8c8e);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_210 = &local_200;
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_200 = *plVar11;
    lStack_1f8 = plVar7[3];
  }
  else {
    local_200 = *plVar11;
    local_210 = (long *)*plVar7;
  }
  local_208 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_278 = *puVar12;
    lStack_270 = plVar7[3];
    local_288 = &local_278;
  }
  else {
    local_278 = *puVar12;
    local_288 = (ulong *)*plVar7;
  }
  local_280 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,uVar15 * 0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar14 = 0xf;
  if (local_288 != &local_278) {
    uVar14 = local_278;
  }
  if (uVar14 < (ulong)(local_228 + local_280)) {
    uVar14 = 0xf;
    if (local_230 != local_220) {
      uVar14 = local_220[0];
    }
    if ((ulong)(local_228 + local_280) <= uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_288);
      goto LAB_014009e2;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_230);
LAB_014009e2:
  local_2a8 = &local_298;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_298 = *plVar7;
    uStack_290 = puVar8[3];
  }
  else {
    local_298 = *plVar7;
    local_2a8 = (long *)*puVar8;
  }
  local_2a0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_1e0 = *plVar11;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar11;
    local_1f0 = (long *)*plVar7;
  }
  local_1e8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  glu::checkError(dVar4,(char *)local_1f0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x10d);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (lVar6 != 0) {
    if (0 < (int)uVar15) {
      lVar13 = 0;
      do {
        *(undefined4 *)((long)pVVar1->m_data + lVar13 + 8) = *(undefined4 *)(lVar6 + 8 + lVar13);
        *(undefined8 *)((long)pVVar1->m_data + lVar13) = *(undefined8 *)(lVar6 + lVar13);
        lVar13 = lVar13 + 0xc;
      } while ((ulong)uVar15 * 0xc != lVar13);
    }
    (**(code **)(lVar5 + 0x1670))(0x8c8e);
    local_1d0->numPrimitives = PVar2;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              (&local_1d0->varying,&local_248);
    pRVar9 = extraout_RAX;
    if (local_248.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      pRVar9 = extraout_RAX_00;
    }
    return pRVar9;
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,(char *)0x0,"mappedData != DE_NULL",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x10e);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

typename TransformFeedbackHandler<AttribType>::Result TransformFeedbackHandler<AttribType>::renderAndGetPrimitives (deUint32 programGL, deUint32 tfPrimTypeGL, int numBindings, const glu::VertexArrayBinding* bindings, int numVertices) const
{
	DE_ASSERT(tfPrimTypeGL == GL_POINTS || tfPrimTypeGL == GL_LINES || tfPrimTypeGL == GL_TRIANGLES);

	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, *m_tf);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, *m_tfBuffer);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *m_tfBuffer);

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *m_tfPrimQuery);
	gl.beginTransformFeedback(tfPrimTypeGL);

	glu::draw(m_renderCtx, programGL, numBindings, bindings, glu::pr::Patches(numVertices));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

	gl.endTransformFeedback();
	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);

	{
		const int numPrimsWritten = (int)getQueryResult(gl, *m_tfPrimQuery);
		return Result(numPrimsWritten, readDataMapped<AttribType>(gl, GL_TRANSFORM_FEEDBACK_BUFFER, numPrimsWritten * numVerticesPerPrimitive(tfPrimTypeGL)));
	}
}